

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

PMJ02BNSampler *
pbrt::PMJ02BNSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  PMJ02BNSampler *pPVar3;
  int *in_RDI;
  int nsamp;
  string *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  allocator<char> *this;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar2 = ParameterDictionary::GetOneInt
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x18));
  if (bVar1) {
    pstd::optional<int>::operator*((optional<int> *)0x75d636);
  }
  pPVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PMJ02BNSampler,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,in_RDI,
                      (polymorphic_allocator<std::byte> *)CONCAT44(iVar2,in_stack_ffffffffffffff90))
  ;
  return pPVar3;
}

Assistant:

PMJ02BNSampler *PMJ02BNSampler::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    return alloc.new_object<PMJ02BNSampler>(nsamp, alloc);
}